

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O1

INTN findPattern(UINT8 *pattern,UINT8 *patternMask,UINTN patternSize,UINT8 *data,UINTN dataSize,
                UINTN dataOff)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  UINTN UVar7;
  UINTN UVar8;
  bool bVar9;
  
  uVar6 = dataSize - dataOff;
  uVar1 = patternSize - 1;
  if (uVar6 <= uVar1 || (dataSize < dataOff || uVar6 == 0)) {
    return -1;
  }
  UVar7 = CONCAT71((int7)(uVar6 >> 8),uVar6 <= uVar1 || (dataSize < dataOff || uVar6 == 0));
  do {
    UVar8 = dataOff;
    if (dataSize < UVar8 + patternSize) {
      return -1;
    }
    dataOff = UVar8;
    bVar9 = patternSize != 0;
    if (patternSize != 0) {
      if ((*patternMask & data[UVar8]) == *pattern) {
        uVar6 = 0;
        do {
          if (uVar1 == uVar6) {
            bVar9 = false;
            goto LAB_0012effe;
          }
          lVar4 = uVar6 + 1;
          lVar3 = uVar6 + UVar8 + 1;
          uVar2 = uVar6 + 1;
          lVar5 = uVar6 + 1;
          uVar6 = uVar2;
        } while ((patternMask[lVar4] & data[lVar3]) == pattern[lVar5]);
        bVar9 = uVar2 < patternSize;
      }
      dataOff = UVar8 + 1;
      UVar8 = UVar7;
    }
LAB_0012effe:
    UVar7 = UVar8;
    if (!bVar9) {
      return UVar8;
    }
  } while( true );
}

Assistant:

INTN findPattern(const UINT8 *pattern, const UINT8 *patternMask, UINTN patternSize,
                 const UINT8 *data, UINTN dataSize, UINTN dataOff)
{
    if (patternSize == 0 || dataSize == 0 || dataOff >= dataSize || dataSize - dataOff < patternSize)
        return -1;
    
    while (dataOff + patternSize <= dataSize) {
        bool matches = true;
        for (UINTN i = 0; i < patternSize; i++) {
            if ((data[dataOff + i] & patternMask[i]) != pattern[i]) {
                matches = false;
                break;
            }
        }
        
        if (matches)
            return static_cast<INTN>(dataOff);
        
        dataOff++;
    }
    
    return -1;
}